

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error raccess_guess_vfat(FT_Library library,FT_Stream stream,char *base_file_name,
                           char **result_file_name,FT_Long *result_offset)

{
  char *pcVar1;
  FT_Memory memory;
  char *newpath;
  FT_Long *result_offset_local;
  char **result_file_name_local;
  char *base_file_name_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  pcVar1 = raccess_make_file_name(library->memory,base_file_name,"resource.frk/");
  if (pcVar1 == (char *)0x0) {
    library_local._4_4_ = 0x40;
  }
  else {
    *result_file_name = pcVar1;
    *result_offset = 0;
    library_local._4_4_ = 0;
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  raccess_guess_vfat( FT_Library  library,
                      FT_Stream   stream,
                      char       *base_file_name,
                      char      **result_file_name,
                      FT_Long    *result_offset )
  {
    char*      newpath;
    FT_Memory  memory;

    FT_UNUSED( stream );


    memory = library->memory;

    newpath = raccess_make_file_name( memory, base_file_name,
                                      "resource.frk/" );
    if ( !newpath )
      return FT_THROW( Out_Of_Memory );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }